

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O0

Interval *
tcu::applyMonotone(Interval *__return_storage_ptr__,DoubleIntervalFunc2 *func,Interval *arg0,
                  Interval *arg1)

{
  Interval local_d0;
  Interval local_b8;
  Interval local_a0;
  Interval local_88;
  Interval local_70;
  Interval local_58;
  double local_40;
  double hi1;
  double lo1;
  double hi0;
  double lo0;
  Interval *arg1_local;
  Interval *arg0_local;
  DoubleIntervalFunc2 *func_local;
  
  lo0 = (double)arg1;
  arg1_local = arg0;
  arg0_local = (Interval *)func;
  hi0 = Interval::lo(arg0);
  lo1 = Interval::hi(arg1_local);
  hi1 = Interval::lo((Interval *)lo0);
  local_40 = Interval::hi((Interval *)lo0);
  (*(code *)arg0_local)(hi0,hi1,&local_70);
  (*(code *)arg0_local)(hi0,local_40,&local_88);
  Interval::Interval(&local_58,&local_70,&local_88);
  (*(code *)arg0_local)(lo1,hi1,&local_b8);
  (*(code *)arg0_local)(lo1,local_40,&local_d0);
  Interval::Interval(&local_a0,&local_b8,&local_d0);
  Interval::Interval(__return_storage_ptr__,&local_58,&local_a0);
  return __return_storage_ptr__;
}

Assistant:

Interval applyMonotone (DoubleIntervalFunc2& func, const Interval& arg0, const Interval& arg1)
{
	double	lo0 = arg0.lo(), hi0 = arg0.hi(), lo1 = arg1.lo(), hi1 = arg1.hi();
	return Interval(Interval(func(lo0, lo1), func(lo0, hi1)),
					Interval(func(hi0, lo1), func(hi0, hi1)));
}